

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,char_writer *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t __n;
  size_t size_1;
  char_type *__s;
  char_type *pcVar4;
  ulong uVar5;
  basic_buffer<char> *c;
  ulong uVar6;
  char __tmp;
  
  uVar5 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar5 - size;
  if (uVar5 < size || __n == 0) {
    uVar5 = size + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    *(char_type *)(puVar2[1] + lVar3) = f->value;
  }
  else {
    uVar6 = lVar3 + uVar5;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    __s = (char_type *)(lVar3 + puVar2[1]);
    bVar1 = (byte)spec->fill_;
    pcVar4 = __s;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = __n >> 1;
      if (1 < __n) {
        pcVar4 = __s + uVar6;
        memset(__s,(uint)bVar1,uVar6);
      }
      *pcVar4 = f->value;
      if (uVar5 != size) {
        __n = __n - uVar6;
LAB_0018b435:
        memset(pcVar4 + 1,(uint)bVar1,__n);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar5 != size) {
        pcVar4 = __s + __n;
        memset(__s,(uint)bVar1,__n);
      }
      *pcVar4 = f->value;
    }
    else {
      *__s = f->value;
      if (uVar5 != size) goto LAB_0018b435;
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}